

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void switch_mode(CPUARMState_conflict *env,int mode)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar2 = env->uncached_cpsr & 0x1f;
  if (uVar2 == mode) {
    return;
  }
  if (uVar2 == 0x11) {
    env->fiq_regs[4] = env->regs[0xc];
    uVar1 = *(undefined8 *)(env->regs + 10);
    *(undefined8 *)env->fiq_regs = *(undefined8 *)(env->regs + 8);
    *(undefined8 *)(env->fiq_regs + 2) = uVar1;
    uVar1 = *(undefined8 *)(env->usr_regs + 2);
    *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->usr_regs;
    *(undefined8 *)(env->regs + 10) = uVar1;
    env->regs[0xc] = env->usr_regs[4];
    lVar3 = 5;
  }
  else {
    if (mode == 0x11) {
      env->usr_regs[4] = env->regs[0xc];
      uVar1 = *(undefined8 *)(env->regs + 10);
      *(undefined8 *)env->usr_regs = *(undefined8 *)(env->regs + 8);
      *(undefined8 *)(env->usr_regs + 2) = uVar1;
      uVar1 = *(undefined8 *)(env->fiq_regs + 2);
      *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->fiq_regs;
      *(undefined8 *)(env->regs + 10) = uVar1;
      env->regs[0xc] = env->fiq_regs[4];
    }
    uVar4 = uVar2 - 0x10;
    if ((0xf < uVar4) || ((0x8ccfU >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_00613887;
    lVar3 = *(long *)(&DAT_00d734b8 + (ulong)uVar4 * 8);
  }
  env->banked_r13[lVar3] = env->regs[0xd];
  env->banked_spsr[lVar3] = (ulong)env->spsr;
  uVar4 = mode - 0x10;
  if ((uVar4 < 0x10) && ((0x8ccfU >> (uVar4 & 0x1f) & 1) != 0)) {
    lVar3 = *(long *)(&DAT_00d734b8 + (ulong)uVar4 * 8);
    env->regs[0xd] = env->banked_r13[lVar3];
    env->spsr = (uint32_t)env->banked_spsr[lVar3];
    uVar2 = uVar2 - 0x10;
    if ((uVar2 < 0x10) &&
       ((((0x8ccfU >> (uVar2 & 0x1f) & 1) != 0 &&
         (env->banked_r14[*(long *)(&DAT_00d73538 + (ulong)uVar2 * 8)] = env->regs[0xe],
         uVar4 < 0x10)) && ((0x8ccfU >> (uVar4 & 0x1f) & 1) != 0)))) {
      env->regs[0xe] = env->banked_r14[*(long *)(&DAT_00d73538 + (ulong)uVar4 * 8)];
      return;
    }
  }
LAB_00613887:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
             ,0x99,(char *)0x0);
}

Assistant:

static void switch_mode(CPUARMState *env, int mode)
{
    int old_mode;
    int i;

    old_mode = env->uncached_cpsr & CPSR_M;
    if (mode == old_mode)
        return;

    if (old_mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->fiq_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->usr_regs, 5 * sizeof(uint32_t));
    } else if (mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->usr_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->fiq_regs, 5 * sizeof(uint32_t));
    }

    i = bank_number(old_mode);
    env->banked_r13[i] = env->regs[13];
    env->banked_spsr[i] = env->spsr;

    i = bank_number(mode);
    env->regs[13] = env->banked_r13[i];
    env->spsr = env->banked_spsr[i];

    env->banked_r14[r14_bank_number(old_mode)] = env->regs[14];
    env->regs[14] = env->banked_r14[r14_bank_number(mode)];
}